

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O2

torrent_status * __thiscall
libtorrent::torrent_status::operator=(torrent_status *this,torrent_status *param_1)

{
  error_category *peVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  bool bVar7;
  undefined3 uVar8;
  
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  bVar7 = (param_1->errc).failed_;
  uVar8 = *(undefined3 *)&(param_1->errc).field_0x5;
  peVar1 = (param_1->errc).cat_;
  (this->errc).val_ = (param_1->errc).val_;
  (this->errc).failed_ = bVar7;
  *(undefined3 *)&(this->errc).field_0x5 = uVar8;
  (this->errc).cat_ = peVar1;
  (this->error_file).m_val = (param_1->error_file).m_val;
  ::std::__cxx11::string::_M_assign((string *)&this->save_path);
  ::std::__cxx11::string::_M_assign((string *)&this->name);
  ::std::__weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->torrent_file).
              super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->torrent_file).
              super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>);
  (this->next_announce).__r = (param_1->next_announce).__r;
  ::std::__cxx11::string::_M_assign((string *)&this->current_tracker);
  iVar2 = param_1->total_download;
  iVar3 = param_1->total_upload;
  iVar4 = param_1->total_payload_download;
  iVar5 = param_1->total_payload_upload;
  iVar6 = param_1->total_redundant_bytes;
  this->total_failed_bytes = param_1->total_failed_bytes;
  this->total_redundant_bytes = iVar6;
  this->total_payload_download = iVar4;
  this->total_payload_upload = iVar5;
  this->total_download = iVar2;
  this->total_upload = iVar3;
  bitfield::operator=(&(this->pieces).super_bitfield,&(param_1->pieces).super_bitfield);
  bitfield::operator=(&(this->verified_pieces).super_bitfield,
                      &(param_1->verified_pieces).super_bitfield);
  memcpy(&this->total_done,&param_1->total_done,0x140);
  return this;
}

Assistant:

torrent_status::torrent_status(torrent_status const&) = default;